

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

void do_cmd_knowledge_shapechange(char *name,wchar_t row)

{
  bitflag *flags;
  size_t len;
  ushort uVar1;
  uint uVar2;
  long lVar3;
  class_book *pcVar4;
  class_spell *pcVar5;
  byte bVar6;
  void *pvVar7;
  _Bool _Var8;
  wchar_t wVar9;
  int iVar10;
  wchar_t wVar11;
  menu_iter *iter;
  ulong uVar12;
  textblock *tb;
  obj_property *poVar13;
  char **ppcVar14;
  textblock *tba;
  object_kind *poVar15;
  ulong uVar16;
  char *pcVar17;
  wchar_t wVar18;
  int *piVar19;
  long lVar20;
  player_class *ppVar21;
  wchar_t wVar22;
  player_shape *ppVar23;
  effect *peVar24;
  int iVar25;
  wchar_t n_00;
  wchar_t n;
  long lVar26;
  player_ability *ppVar27;
  menu *m;
  bool bVar28;
  ui_event uVar29;
  wchar_t wnew;
  wchar_t hnew;
  region_conflict list_region;
  region_conflict header_region;
  char toa_msg [24];
  char tod_msg [24];
  char toh_msg [24];
  wchar_t local_338;
  wchar_t local_334;
  ui_event local_330;
  void *local_320;
  ui_event local_318;
  menu *local_308;
  uint local_2fc;
  class_book *local_2f8;
  void *local_2f0;
  ulong local_2e8;
  long local_2e0;
  char ***local_2d8 [4];
  region local_2b8;
  region_conflict local_2a8;
  char **local_298 [26];
  char **local_1c8 [26];
  char **local_f8 [25];
  
  local_2a8.col = L'\0';
  local_2a8.row = L'\0';
  local_2a8.width = L'\xffffffff';
  local_2a8.page_rows = L'\x05';
  local_2b8.col = 0;
  local_2b8.row = 6;
  local_2b8.width = -1;
  local_2b8.page_rows = -2;
  wVar9 = count_interesting_shapes();
  if (wVar9 == L'\0') {
    return;
  }
  iter = menu_find_iter(MN_ITER_STRINGS);
  local_308 = menu_new(MN_SKIN_SCROLL,iter);
  len = (long)wVar9 * 8;
  local_334 = wVar9;
  local_320 = mem_alloc(len);
  if (shapes != (player_shape *)0x0) {
    iVar25 = 0;
    ppVar23 = shapes;
    do {
      iVar10 = strcmp(ppVar23->name,"normal");
      if (iVar10 != 0) {
        *(player_shape **)((long)local_320 + (long)iVar25 * 8) = ppVar23;
        iVar25 = iVar25 + 1;
      }
      ppVar23 = ppVar23->next;
    } while (ppVar23 != (player_shape *)0x0);
  }
  pvVar7 = local_320;
  sort(local_320,(long)wVar9,8,compare_shape_names);
  local_2f0 = mem_alloc(len);
  m = local_308;
  if (L'\0' < local_334) {
    uVar16 = 0;
    do {
      *(undefined8 *)((long)local_2f0 + uVar16 * 8) =
           *(undefined8 *)(*(long *)((long)pvVar7 + uVar16 * 8) + 8);
      uVar16 = uVar16 + 1;
    } while ((uint)local_334 != uVar16);
  }
  menu_setpriv(local_308,wVar9,local_2f0);
  menu_layout(m,&local_2b8);
  *(byte *)&m->flags = (byte)m->flags | 0x10;
  screen_save();
  clear_from(L'\0');
  bVar6 = 1;
  uVar16 = 0;
  wVar9 = L'\xffffffff';
  wVar11 = L'\0';
  do {
    local_318._8_4_ = 0;
    local_318.type = EVT_NONE;
    local_318.mouse.x = '\0';
    local_318.mouse.y = '\0';
    local_318.mouse.button = '\0';
    local_318.mouse.mods = '\0';
    Term_get_size(&local_338,(int *)&local_2fc);
    uVar2 = local_2fc;
    uVar12 = (ulong)local_2fc;
    if (!(bool)((uint)uVar16 == local_2fc & (bVar6 ^ 1))) {
      region_erase(&local_2a8);
      prt("Knowledge - shapes",L'\x02',L'\0');
      prt("Name",L'\x04',L'\0');
      if (L'\0' < local_338) {
        wVar18 = L'\0';
        do {
          Term_putch(wVar18,L'\x05',L'\x01',L'=');
          wVar18 = wVar18 + L'\x01';
          wVar22 = local_338;
          if (L'O' < local_338) {
            wVar22 = L'P';
          }
        } while (wVar18 < wVar22);
      }
      prt("<dir>, \'r\' to recall, ESC",uVar2 + L'\xfffffffe',L'\0');
    }
    if (wVar9 != wVar11) {
      m->cursor = wVar11;
    }
    menu_refresh(m,false);
    handle_stuff(player);
    uVar29 = inkey_ex();
    local_330.mouse = uVar29.mouse;
    local_330.key.mods = uVar29.key.mods;
    if (uVar29.type == EVT_KBRD) {
      menu_handle_keypress(m,&local_330,&local_318);
    }
    else if (uVar29.type == EVT_MOUSE) {
      menu_handle_mouse(m,&local_330,&local_318);
    }
    if (local_318.type != EVT_NONE) {
      local_330._8_4_ = local_318._8_4_;
      local_330.mouse = local_318.mouse;
    }
    wVar18 = wVar11;
    if ((int)local_330.type < 0x20) {
      if (local_330.type == EVT_KBRD) {
        if ((local_330.key.code & 0xffffffdf) == 0x52) goto LAB_001d7a86;
      }
      else if (local_330.type == EVT_ESCAPE) {
        screen_load();
        mem_free(local_2f0);
        mem_free(local_320);
        menu_free(m);
        return;
      }
    }
    else if (local_330.type == EVT_MOVE) {
      wVar18 = m->cursor;
    }
    else if ((local_330.type == EVT_SELECT) && (wVar11 == m->cursor)) {
LAB_001d7a86:
      if ((wVar11 < L'\0') || (local_334 <= wVar11)) {
        __assert_fail("mark >= 0 && mark < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                      ,0xc6e,"void do_cmd_knowledge_shapechange(const char *, int)");
      }
      lVar3 = *(long *)((long)local_320 + (ulong)(uint)wVar11 * 8);
      tb = textblock_new();
      textblock_append(tb,"%s",*(undefined8 *)(lVar3 + 8));
      textblock_append(tb,
                       "\nLike all shapes, the equipment at the time of the shapechange sets the base attributes, including damage per blow, number of blows and resistances.  While changed, items in your pack or on the floor (except for pickup or eating) are inaccessible.  To switch back to your normal shape, cast a spell or use an item command other than eat (drop, for instance).\n"
                      );
      bVar28 = *(int *)(lVar3 + 0x14) != 0;
      if (bVar28) {
        strnfmt((char *)local_298,0x18,"%+d to AC");
        local_2d8[0] = local_298;
      }
      uVar16 = (ulong)bVar28;
      local_2e8 = uVar12;
      if (*(int *)(lVar3 + 0x18) != 0) {
        strnfmt((char *)local_f8,0x18,"%+d to hit");
        local_2d8[uVar16] = local_f8;
        uVar16 = (ulong)(bVar28 + 1);
      }
      wVar9 = (wchar_t)uVar16;
      if (*(int *)(lVar3 + 0x1c) == 0) {
        if (wVar9 != L'\0') goto LAB_001d7bb6;
      }
      else {
        strnfmt((char *)local_1c8,0x18,"%+d to damage");
        local_2d8[uVar16] = local_1c8;
        wVar9 = wVar9 + L'\x01';
LAB_001d7bb6:
        textblock_append(tb,"Adds");
        shape_lore_append_list(tb,(char **)local_2d8,wVar9);
        textblock_append(tb,".\n");
      }
      local_298[0] = (char **)0x0;
      local_f8[0]._0_4_ = 0;
      local_1c8[0]._0_4_ = L'\0';
      piVar19 = &DAT_0027c5e4;
      uVar16 = 0;
      do {
        uVar2 = *(uint *)(lVar3 + 0x20 + uVar16 * 4);
        if (uVar2 != 0) {
          pcVar17 = "unknown skill";
          if (uVar16 < 10) {
            pcVar17 = (char *)((long)&DAT_0027c5e4 + (long)*piVar19);
          }
          pcVar17 = format("%+d to %s",(ulong)uVar2,pcVar17);
          shape_lore_helper_append_to_list(pcVar17,local_298,(int *)local_f8,(int *)local_1c8);
        }
        wVar9 = (wchar_t)local_1c8[0];
        uVar16 = uVar16 + 1;
        piVar19 = piVar19 + 1;
      } while (uVar16 != 10);
      lVar20 = (long)(wchar_t)local_1c8[0];
      ppcVar14 = local_298[0];
      if (0 < lVar20) {
        textblock_append(tb,"Adds");
        ppcVar14 = local_298[0];
        shape_lore_append_list(tb,local_298[0],wVar9);
        textblock_append(tb,".\n");
        lVar26 = 0;
        do {
          string_free(ppcVar14[lVar26]);
          lVar26 = lVar26 + 1;
        } while (lVar20 != lVar26);
      }
      mem_free(ppcVar14);
      local_298[0] = (char **)0x0;
      local_f8[0]._0_4_ = 0;
      local_1c8[0]._0_4_ = L'\0';
      lVar20 = 0;
      do {
        uVar2 = *(uint *)(lVar3 + 100 + lVar20 * 4);
        if (uVar2 != 0) {
          poVar13 = lookup_obj_property(2,(int)lVar20 + 5);
          pcVar17 = format("%+d to %s",(ulong)uVar2,poVar13->name);
          shape_lore_helper_append_to_list(pcVar17,local_298,(int *)local_f8,(int *)local_1c8);
        }
        wVar9 = (wchar_t)local_1c8[0];
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0xb);
      lVar20 = (long)(wchar_t)local_1c8[0];
      ppcVar14 = local_298[0];
      if (0 < lVar20) {
        textblock_append(tb,"Adds");
        ppcVar14 = local_298[0];
        shape_lore_append_list(tb,local_298[0],wVar9);
        textblock_append(tb,".\n");
        lVar26 = 0;
        do {
          string_free(ppcVar14[lVar26]);
          lVar26 = lVar26 + 1;
        } while (lVar20 != lVar26);
      }
      mem_free(ppcVar14);
      local_298[0] = (char **)0x0;
      local_f8[0]._0_4_ = 0;
      local_1c8[0]._0_4_ = L'\0';
      lVar20 = 0;
      do {
        uVar2 = *(uint *)(lVar3 + 0x50 + lVar20 * 4);
        if (uVar2 != 0) {
          poVar13 = lookup_obj_property(2,(int)lVar20);
          pcVar17 = format("%+d to %s",(ulong)uVar2,poVar13->name);
          shape_lore_helper_append_to_list(pcVar17,local_298,(int *)local_f8,(int *)local_1c8);
        }
        wVar9 = (wchar_t)local_1c8[0];
        lVar20 = lVar20 + 1;
      } while (lVar20 != 5);
      lVar20 = (long)(wchar_t)local_1c8[0];
      ppcVar14 = local_298[0];
      if (0 < lVar20) {
        textblock_append(tb,"Adds");
        ppcVar14 = local_298[0];
        shape_lore_append_list(tb,local_298[0],wVar9);
        textblock_append(tb,".\n");
        lVar26 = 0;
        do {
          string_free(ppcVar14[lVar26]);
          lVar26 = lVar26 + 1;
        } while (lVar20 != lVar26);
      }
      mem_free(ppcVar14);
      ppcVar14 = &projections->name;
      lVar20 = 0;
      n_00 = L'\0';
      wVar22 = L'\0';
      wVar9 = L'\0';
      do {
        uVar1 = *(ushort *)(lVar3 + 0x90 + lVar20 * 4);
        if ((short)uVar1 < 0) {
          local_298[wVar9] = (char **)*ppcVar14;
          wVar9 = wVar9 + L'\x01';
        }
        else if (uVar1 < 3) {
          if (uVar1 != 0) {
            local_f8[wVar22] = (char **)*ppcVar14;
            wVar22 = wVar22 + L'\x01';
          }
        }
        else {
          local_1c8[n_00] = (char **)*ppcVar14;
          n_00 = n_00 + L'\x01';
        }
        lVar20 = lVar20 + 1;
        ppcVar14 = ppcVar14 + 0xd;
      } while (lVar20 != 0x19);
      if (wVar9 != L'\0') {
        textblock_append(tb,"Makes you vulnerable to");
        shape_lore_append_list(tb,(char **)local_298,wVar9);
        textblock_append(tb,".\n");
      }
      if (wVar22 != L'\0') {
        textblock_append(tb,"Makes you resistant to");
        shape_lore_append_list(tb,(char **)local_f8,wVar22);
        textblock_append(tb,".\n");
      }
      if (n_00 != L'\0') {
        textblock_append(tb,"Makes you immune to");
        shape_lore_append_list(tb,(char **)local_1c8,n_00);
        textblock_append(tb,".\n");
      }
      local_298[0] = (char **)0x0;
      local_f8[0]._0_4_ = 0;
      local_1c8[0]._0_4_ = L'\0';
      flags = (bitflag *)(lVar3 + 0x48);
      iVar25 = 1;
      do {
        poVar13 = lookup_obj_property(3,iVar25);
        if ((poVar13->subtype == L'\x02') &&
           (_Var8 = flag_has_dbg(flags,5,poVar13->index,"s->flags","prop->index"), _Var8)) {
          shape_lore_helper_append_to_list(poVar13->desc,local_298,(int *)local_f8,(int *)local_1c8)
          ;
        }
        wVar9 = (wchar_t)local_1c8[0];
        iVar25 = iVar25 + 1;
      } while (iVar25 != 0x27);
      lVar20 = (long)(wchar_t)local_1c8[0];
      ppcVar14 = local_298[0];
      if (0 < lVar20) {
        textblock_append(tb,"Provides protection from");
        ppcVar14 = local_298[0];
        shape_lore_append_list(tb,local_298[0],wVar9);
        textblock_append(tb,".\n");
        lVar26 = 0;
        do {
          string_free(ppcVar14[lVar26]);
          lVar26 = lVar26 + 1;
        } while (lVar20 != lVar26);
      }
      mem_free(ppcVar14);
      local_298[0] = (char **)0x0;
      iVar25 = 0;
      local_f8[0]._0_4_ = 0;
      local_1c8[0]._0_4_ = L'\0';
      do {
        poVar13 = lookup_obj_property(1,iVar25);
        iVar10 = sustain_flag(poVar13->index);
        _Var8 = flag_has_dbg(flags,5,iVar10,"s->flags","sustain_flag(prop->index)");
        if (_Var8) {
          shape_lore_helper_append_to_list(poVar13->name,local_298,(int *)local_f8,(int *)local_1c8)
          ;
        }
        wVar9 = (wchar_t)local_1c8[0];
        iVar25 = iVar25 + 1;
      } while (iVar25 != 5);
      lVar20 = (long)(wchar_t)local_1c8[0];
      ppcVar14 = local_298[0];
      if (0 < lVar20) {
        textblock_append(tb,"Sustains");
        ppcVar14 = local_298[0];
        shape_lore_append_list(tb,local_298[0],wVar9);
        textblock_append(tb,".\n");
        lVar26 = 0;
        do {
          string_free(ppcVar14[lVar26]);
          lVar26 = lVar26 + 1;
        } while (lVar20 != lVar26);
      }
      mem_free(ppcVar14);
      iVar25 = 1;
      iVar10 = 0;
      do {
        poVar13 = lookup_obj_property(3,iVar25);
        if ((((uint)poVar13->subtype < 7) && ((0x68U >> (poVar13->subtype & 0x1fU) & 1) != 0)) &&
           (_Var8 = flag_has_dbg(flags,5,poVar13->index,"s->flags","prop->index"), _Var8)) {
          pcVar17 = "";
          if (0 < iVar10) {
            pcVar17 = "  ";
          }
          textblock_append(tb,"%s%s.",pcVar17);
          iVar10 = iVar10 + 1;
        }
        iVar25 = iVar25 + 1;
      } while (iVar25 != 0x27);
      if (player_abilities != (player_ability *)0x0) {
        ppVar27 = player_abilities;
        do {
          iVar25 = strcmp(ppVar27->type,"player");
          if ((iVar25 == 0) &&
             (_Var8 = flag_has_dbg((bitflag *)(lVar3 + 0x4d),3,(uint)ppVar27->index,"s->pflags",
                                   "ability->index"), _Var8)) {
            pcVar17 = "";
            if (0 < iVar10) {
              pcVar17 = "  ";
            }
            textblock_append(tb,"%s%s",pcVar17);
            iVar10 = iVar10 + 1;
          }
          ppVar27 = ppVar27->next;
        } while (ppVar27 != (player_ability *)0x0);
      }
      if (0 < iVar10) {
        textblock_append(tb,"\n");
      }
      tba = effect_describe(*(effect **)(lVar3 + 0xf8),"Changing into the shape ",0,false);
      m = local_308;
      if (tba != (textblock *)0x0) {
        textblock_append_textblock(tb,tba);
        textblock_free(tba);
        textblock_append(tb,".\n");
      }
      if (classes != (player_class *)0x0) {
        iVar25 = 0;
        ppVar21 = classes;
        do {
          if (L'\0' < (ppVar21->magic).num_books) {
            lVar20 = 0;
            do {
              pcVar4 = (ppVar21->magic).books;
              poVar15 = lookup_kind(pcVar4[lVar20].tval,pcVar4[lVar20].sval);
              local_2e0 = lVar20;
              if ((poVar15 != (object_kind *)0x0) && (poVar15->name != (char *)0x0)) {
                local_2f8 = pcVar4 + lVar20;
                wVar9 = local_2f8->num_spells;
                if (L'\0' < wVar9) {
                  lVar20 = 0;
                  do {
                    pcVar5 = local_2f8->spells;
                    peVar24 = pcVar5[lVar20].effect;
                    if (peVar24 != (effect *)0x0) {
                      do {
                        if ((peVar24->index == 0x62) &&
                           (peVar24->subtype == *(wchar_t *)(lVar3 + 0x10))) {
                          if (iVar25 == 0) {
                            textblock_append(tb,"\n");
                          }
                          textblock_append(tb,"The %s spell, %s, from %s triggers the shapechange.",
                                           ppVar21->name,pcVar5[lVar20].name,poVar15->name);
                          iVar25 = iVar25 + 1;
                        }
                        peVar24 = peVar24->next;
                      } while (peVar24 != (effect *)0x0);
                      wVar9 = local_2f8->num_spells;
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar20 < wVar9);
                }
              }
              lVar20 = local_2e0 + 1;
            } while (lVar20 < (ppVar21->magic).num_books);
          }
          m = local_308;
          ppVar21 = ppVar21->next;
        } while (ppVar21 != (player_class *)0x0);
        if (0 < iVar25) {
          textblock_append(tb,"\n");
        }
      }
      textui_textblock_show(tb,(region_conflict)ZEXT816(0),(char *)0x0);
      textblock_free(tb);
      uVar12 = local_2e8;
    }
    bVar6 = 0;
    uVar16 = uVar12;
    wVar9 = wVar11;
    wVar11 = wVar18;
  } while( true );
}

Assistant:

static void do_cmd_knowledge_shapechange(const char *name, int row)
{
	region header_region = { 0, 0, -1, 5 };
	region list_region = { 0, 6, -1, -2 };
	int count = count_interesting_shapes();
	struct menu* m;
	struct player_shape **sarray;
	const char **narray;
	int h, mark, mark_old;
	bool displaying, redraw;
	struct player_shape *s;
	int i;

	if (!count) {
		return;
	}

	m = menu_new(MN_SKIN_SCROLL, menu_find_iter(MN_ITER_STRINGS));

	/* Set up an easily indexable list of the interesting shapes. */
	sarray = mem_alloc(count * sizeof(*sarray));
	for (s = shapes, i = 0; s; s = s->next) {
		if (streq(s->name, "normal")) {
			continue;
		}
		sarray[i] = s;
		++i;
	}

	/*
	 * Sort them alphabetically by name and set up an array with just the
	 * names.
	 */
	sort(sarray, count, sizeof(sarray[0]), compare_shape_names);
	narray = mem_alloc(count * sizeof(*narray));
	for (i = 0; i < count; ++i) {
		narray[i] = sarray[i]->name;
	}

	menu_setpriv(m, count, narray);
	menu_layout(m, &list_region);
	m->flags |= MN_DBL_TAP;

	screen_save();
	clear_from(0);

	h = 0;
	mark = 0;
	mark_old = -1;
	displaying = true;
	redraw = true;
	while (displaying) {
		bool recall = false;
		int wnew, hnew;
		ui_event ke0 = EVENT_EMPTY;
		ui_event ke;

		Term_get_size(&wnew, &hnew);
		if (h != hnew) {
			h = hnew;
			redraw = true;
		}

		if (redraw) {
			region_erase(&header_region);
			prt("Knowledge - shapes", 2, 0);
			prt("Name", 4, 0);
			for (i = 0; i < MIN(80, wnew); i++) {
				Term_putch(i, 5, COLOUR_WHITE, L'=');
			}
			prt("<dir>, 'r' to recall, ESC", h - 2, 0);
			redraw = false;
		}

		if (mark_old != mark) {
			mark_old = mark;
			m->cursor = mark;
		}

		menu_refresh(m, false);

		handle_stuff(player);

		ke = inkey_ex();
		if (ke.type == EVT_MOUSE) {
			menu_handle_mouse(m, &ke, &ke0);
		} else if (ke.type == EVT_KBRD) {
			menu_handle_keypress(m, &ke, &ke0);
		}
		if (ke0.type != EVT_NONE) {
			ke = ke0;
		}

		switch (ke.type) {
			case EVT_KBRD:
				if (ke.key.code == 'r' || ke.key.code == 'R') {
					recall = true;
				}
				break;

			case EVT_ESCAPE:
				displaying = false;
				break;

			case EVT_SELECT:
				if (mark == m->cursor) {
					recall = true;
				}
				break;

			case EVT_MOVE:
				mark = m->cursor;
				break;

			default:
				break;
		}

		if (recall) {
			assert(mark >= 0 && mark < count);
			shape_lore(sarray[mark]);
		}
	}

	screen_load();

	mem_free(narray);
	mem_free(sarray);
	menu_free(m);
}